

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.h
# Opt level: O2

bool __thiscall
cmWorkerPool::
EmplaceJob<cmQtAutoMocUic::JobMocT,std::shared_ptr<cmQtAutoMocUic::MappingT>const&,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>
          (cmWorkerPool *this,shared_ptr<cmQtAutoMocUic::MappingT> *args,
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args_1)

{
  bool bVar1;
  _Head_base<0UL,_cmWorkerPool::JobT_*,_false> local_20;
  element_type *local_18;
  
  std::
  make_unique<cmQtAutoMocUic::JobMocT,std::shared_ptr<cmQtAutoMocUic::MappingT>const&,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>
            ((shared_ptr<cmQtAutoMocUic::MappingT> *)&local_18,
             (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)args);
  local_20._M_head_impl = (JobT *)local_18;
  local_18 = (element_type *)0x0;
  bVar1 = PushJob(this,(JobHandleT *)&local_20);
  if ((element_type *)local_20._M_head_impl != (element_type *)0x0) {
    (*(code *)(((((SourceFileHandleT *)&(local_20._M_head_impl)->_vptr_JobT)->
                super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->FileName)._M_string_length)();
  }
  local_20._M_head_impl = (JobT *)0x0;
  if (local_18 != (element_type *)0x0) {
    (*(code *)(((local_18->SourceFile).
                super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->FileName)._M_string_length)();
  }
  return bVar1;
}

Assistant:

bool EmplaceJob(Args&&... args)
  {
    return PushJob(cm::make_unique<T>(std::forward<Args>(args)...));
  }